

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<4>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  CodedOutputStream *in_RSI;
  void *in_RDI;
  
  Get<unsigned_long>(in_RDI);
  io::CodedOutputStream::WriteVarint64(in_RSI,(uint64)in_RDI);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteUInt64NoTag(Get<uint64>(ptr), output);
  }